

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O3

void glfwDefaultWindowHints(void)

{
  if (_glfwInitialized != '\0') {
    _glfw.hints.context.minor = 0;
    _glfw.hints.context.forward = '\0';
    _glfw.hints.context.debug = '\0';
    _glfw.hints.context._14_2_ = 0;
    _glfw.hints.window.monitor = (_GLFWmonitor *)0x0;
    _glfw.hints.framebuffer.glx = (GLXFBConfig)0x0;
    _glfw.hints.context.share = (_GLFWwindow *)0x0;
    _glfw.hints.context.profile = 0;
    _glfw.hints.context.robustness = 0;
    _glfw.hints.context.release = 0;
    _glfw.hints.context._28_4_ = 0;
    _glfw.hints.window.width = 0;
    _glfw.hints.window.height = 0;
    _glfw.hints.window.title = (char *)0x0;
    _glfw.hints.framebuffer.auxBuffers = 0;
    _glfw.hints.framebuffer.stereo = 0;
    _glfw.hints.framebuffer.samples = 0;
    _glfw.hints.framebuffer.sRGB = 0;
    _glfw.hints.framebuffer.accumRedBits = 0;
    _glfw.hints.framebuffer.accumGreenBits = 0;
    _glfw.hints.framebuffer.accumBlueBits = 0;
    _glfw.hints.framebuffer.accumAlphaBits = 0;
    _glfw.hints.context.api = 0x30001;
    _glfw.hints.context.major = 1;
    _glfw.hints.window.resizable = '\x01';
    _glfw.hints.window.visible = '\x01';
    _glfw.hints.window.decorated = '\x01';
    _glfw.hints.window.focused = '\x01';
    _glfw.hints.window.autoIconify = '\x01';
    _glfw.hints.window.floating = '\0';
    _glfw.hints.window._22_2_ = 0;
    _glfw.hints.framebuffer.redBits = 8;
    _glfw.hints.framebuffer.greenBits = 8;
    _glfw.hints.framebuffer.blueBits = 8;
    _glfw.hints.framebuffer.alphaBits = 8;
    _glfw.hints.framebuffer.depthBits = 0x18;
    _glfw.hints.framebuffer.stencilBits = 8;
    _glfw.hints.framebuffer.doublebuffer = 1;
    _glfw.hints.framebuffer._60_4_ = 0;
    _glfw.hints.refreshRate = -1;
    _glfw.hints._148_4_ = 0;
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

void glfwDefaultWindowHints(void)
{
    _GLFW_REQUIRE_INIT();

    memset(&_glfw.hints, 0, sizeof(_glfw.hints));

    // The default is OpenGL with minimum version 1.0
    _glfw.hints.context.api   = GLFW_OPENGL_API;
    _glfw.hints.context.major = 1;
    _glfw.hints.context.minor = 0;

    // The default is a focused, visible, resizable window with decorations
    _glfw.hints.window.resizable   = GL_TRUE;
    _glfw.hints.window.visible     = GL_TRUE;
    _glfw.hints.window.decorated   = GL_TRUE;
    _glfw.hints.window.focused     = GL_TRUE;
    _glfw.hints.window.autoIconify = GL_TRUE;

    // The default is 24 bits of color, 24 bits of depth and 8 bits of stencil,
    // double buffered
    _glfw.hints.framebuffer.redBits      = 8;
    _glfw.hints.framebuffer.greenBits    = 8;
    _glfw.hints.framebuffer.blueBits     = 8;
    _glfw.hints.framebuffer.alphaBits    = 8;
    _glfw.hints.framebuffer.depthBits    = 24;
    _glfw.hints.framebuffer.stencilBits  = 8;
    _glfw.hints.framebuffer.doublebuffer = GL_TRUE;

    // The default is to select the highest available refresh rate
    _glfw.hints.refreshRate = GLFW_DONT_CARE;
}